

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalize_fake_var_array.hpp
# Opt level: O1

void __thiscall
front::optimization::scalize_fake_var_array::ScalizeFakeVarArray::optimize_functiom
          (ScalizeFakeVarArray *this,string *funcName,MirPackage *package,
          BmirVariableTable *bmirVariableTable,
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          *insts)

{
  __index_type _Var1;
  _Rb_tree_color _Var2;
  uint32_t uVar3;
  uint uVar4;
  int32_t iVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pvVar7;
  pointer pcVar8;
  element_type *peVar9;
  pointer piVar10;
  _Base_ptr p_Var11;
  int iVar12;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar13;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar17;
  const_iterator cVar18;
  AssignInst *__p;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar21;
  const_iterator cVar22;
  undefined8 uVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  _Rb_tree_header *p_Var26;
  _Rb_tree_header *p_Var27;
  byte bVar28;
  ulong uVar29;
  const_iterator __position;
  bool bVar30;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  pVar31;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  tmpVarId2Offset;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tmpVarId2VarSingleName;
  uint32_t local_1e0;
  anon_class_1_0_00000001 local_1d9;
  AssignInst *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  _Variadic_union<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_1c8;
  undefined1 local_1b8 [36];
  uint32_t local_194;
  BmirVariableTable *local_190;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
  *local_188;
  _Base_ptr local_180;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  *local_178;
  _func_int **local_170;
  _func_int **local_168;
  AssignInst *local_160;
  _Base_ptr local_158;
  key_type local_150;
  key_type local_130;
  key_type local_110;
  key_type local_f0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_d0;
  key_type local_a0;
  key_type local_80;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __position._M_current =
       (insts->
       super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_190 = bmirVariableTable;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__position._M_current !=
      (insts->
      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_188 = &bmirVariableTable->name2VarSingle;
    local_158 = &(bmirVariableTable->name2VarArray)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_180 = &(bmirVariableTable->name2VarSingle)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_168 = (_func_int **)&PTR_display_001f0018;
    local_170 = (_func_int **)&PTR_display_001effc8;
    local_178 = insts;
    do {
      p_Var27 = &local_d0._M_impl.super__Rb_tree_header;
      _Var1 = ((__position._M_current)->
              super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ).
              super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ._M_index;
      if (_Var1 == '\x02') {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
        ::clear(&local_d0);
      }
      else if (_Var1 == '\0') {
        pvVar13 = std::
                  get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                            (__position._M_current);
        peVar6 = (pvVar13->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (pvVar13->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        iVar12 = (*(peVar6->super_Displayable)._vptr_Displayable[1])(peVar6);
        if (iVar12 == 1) {
          uVar4 = (peVar6->dest).id;
          p_Var24 = &p_Var27->_M_header;
          for (p_Var25 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var25 != (_Rb_tree_header *)0x0;
              p_Var25 = (&p_Var25->_M_left)[bVar30]) {
            bVar30 = (uint)*(size_t *)(p_Var25 + 1) < uVar4;
            if (!bVar30) {
              p_Var24 = p_Var25;
            }
          }
          p_Var26 = p_Var27;
          if (((_Rb_tree_header *)p_Var24 != p_Var27) &&
             (p_Var26 = (_Rb_tree_header *)p_Var24,
             uVar4 < (uint)((_Rb_tree_header *)p_Var24)->_M_node_count)) {
            p_Var26 = p_Var27;
          }
          if (p_Var26 != p_Var27) {
            if (*(char *)&peVar6[3].dest.super_Displayable._vptr_Displayable == '\0') {
              pvVar21 = std::get<0ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)&peVar6[2].dest.id);
              iVar12 = *pvVar21;
              local_1c8._0_4_ = (peVar6->dest).id;
              pmVar15 = std::
                        map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                      *)&local_d0,(key_type_conflict *)&local_1c8);
              pmVar15->second = pmVar15->second + iVar12;
            }
            else {
              local_1c8._0_4_ = uVar4;
              pVar31 = std::
                       _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                       ::equal_range(&local_d0,(key_type_conflict *)&local_1c8);
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
              ::_M_erase_aux(&local_d0,(_Base_ptr)pVar31.first._M_node,
                             (_Base_ptr)pVar31.second._M_node);
            }
          }
        }
        else if (iVar12 == 2) {
          if (*(char *)&peVar6[2].dest.super_Displayable._vptr_Displayable == '\x01') {
            pvVar17 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                                ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(peVar6 + 1));
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar8 = (pvVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar8,pcVar8 + pvVar17->_M_string_length);
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                             *)local_190,&local_f0);
            if (cVar18._M_node == local_158) {
              bVar28 = 0;
            }
            else {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              pcVar8 = (pvVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,pcVar8,pcVar8 + pvVar17->_M_string_length);
              pmVar16 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                        ::at(&local_190->name2VarArray,&local_110);
              bVar28 = ((pmVar16->
                        super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->changed ^ 1;
            }
            if ((cVar18._M_node != local_158) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2)) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if (bVar28 == 0) {
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              pcVar8 = (pvVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,pcVar8,pcVar8 + pvVar17->_M_string_length);
              cVar22 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                       ::find(&local_188->_M_t,&local_130);
              if (cVar22._M_node == local_180) {
                bVar28 = 0;
              }
              else {
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                pcVar8 = (pvVar17->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,pcVar8,pcVar8 + pvVar17->_M_string_length);
                pmVar20 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                          ::at(local_188,&local_150);
                bVar28 = ((pmVar20->
                          super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->changed ^ 1;
              }
              if ((cVar22._M_node != local_180) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2)) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              if (bVar28 != 0) {
                local_1c8._0_4_ = (peVar6->dest).id;
                pmVar19 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_60,(key_type_conflict *)&local_1c8);
                std::__cxx11::string::_M_assign((string *)pmVar19);
              }
            }
            else {
              local_1c8._0_8_ = local_1b8;
              pcVar8 = (pvVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,pcVar8,pcVar8 + pvVar17->_M_string_length);
              local_1b8._16_4_ = 0;
              local_1d8 = (AssignInst *)CONCAT44(local_1d8._4_4_,(peVar6->dest).id);
              pmVar15 = std::
                        map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                      *)&local_d0,(key_type_conflict *)&local_1d8);
              std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_1c8._M_first);
              pmVar15->second = local_1b8._16_4_;
              if ((AssignInst *)local_1c8._0_8_ != (AssignInst *)local_1b8) {
                operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1b8._1_7_,local_1b8[0]) + 1);
              }
            }
          }
        }
        else if (iVar12 == 3) {
          pvVar14 = std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)&peVar6[1].dest);
          _Var2 = pvVar14->id;
          p_Var27 = &local_d0._M_impl.super__Rb_tree_header;
          p_Var24 = &p_Var27->_M_header;
          for (p_Var25 = local_d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var25 != (_Base_ptr)0x0; p_Var25 = (&p_Var25->_M_left)[bVar30]) {
            bVar30 = p_Var25[1]._M_color < _Var2;
            if (!bVar30) {
              p_Var24 = p_Var25;
            }
          }
          p_Var26 = &local_60._M_impl.super__Rb_tree_header;
          p_Var25 = &p_Var27->_M_header;
          if (((_Rb_tree_header *)p_Var24 != p_Var27) &&
             (p_Var25 = p_Var24, _Var2 < p_Var24[1]._M_color)) {
            p_Var25 = &p_Var27->_M_header;
          }
          p_Var24 = &p_Var26->_M_header;
          p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          if ((_Rb_tree_header *)p_Var25 == p_Var27) {
            for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                p_Var11 = (&p_Var11->_M_left)[bVar30]) {
              bVar30 = (_Rb_tree_color)*(size_t *)(p_Var11 + 1) < _Var2;
              if (!bVar30) {
                p_Var24 = p_Var11;
              }
            }
            p_Var27 = p_Var26;
            if (((_Rb_tree_header *)p_Var24 != p_Var26) &&
               (p_Var27 = (_Rb_tree_header *)p_Var24,
               _Var2 < (_Rb_tree_color)((_Rb_tree_header *)p_Var24)->_M_node_count)) {
              p_Var27 = p_Var26;
            }
            if (p_Var27 != p_Var26) {
              pvVar7 = (insts->
                       super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              __p = (AssignInst *)operator_new(0x38);
              uVar3 = (peVar6->dest).id;
              local_1e0 = pvVar14->id;
              pmVar19 = std::
                        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_60,&local_1e0);
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              pcVar8 = (pmVar19->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a0,pcVar8,pcVar8 + pmVar19->_M_string_length);
              pmVar20 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                        ::at(local_188,&local_a0);
              iVar5 = ((pmVar20->
                       super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->initValue;
              (__p->super_Inst).dest.super_Displayable._vptr_Displayable =
                   (_func_int **)&PTR_display_001ee058;
              (__p->super_Inst).dest.id = uVar3;
              (__p->super_Inst).super_Displayable._vptr_Displayable = local_168;
              (__p->src).field_0x18 = 0;
              *(int32_t *)&(__p->src).field_0x8 = iVar5;
              (__p->src).super_Displayable._vptr_Displayable = local_170;
              (__p->src).shift = Lsl;
              (__p->src).shift_amount = '\0';
              local_1d8 = __p;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mir::inst::AssignInst*>(&_Stack_1d0,__p);
              insts = local_178;
              local_1c8._0_8_ = local_1d8;
              local_1c8._8_8_ = _Stack_1d0._M_pi;
              local_1d8 = (AssignInst *)0x0;
              _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_1b8[0] = 0;
              std::
              vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
              ::_M_insert_rval(local_178,__position,(value_type *)&local_1c8._M_first);
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                ::_S_vtable._M_arr[local_1b8[0]]._M_data)
                        ((anon_class_1_0_00000001 *)&local_194,
                         (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                          *)&local_1c8._M_first);
              local_1b8[0] = 0xff;
              if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d0._M_pi);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              std::
              vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
              ::_M_erase(insts,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                *)((long)__position._M_current +
                                  (long)(insts->
                                        super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start +
                                  (0x18 - (long)pvVar7)));
            }
          }
          else {
            pvVar7 = (insts->
                     super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_160 = (AssignInst *)operator_new(0x38);
            uVar3 = (peVar6->dest).id;
            local_1e0 = pvVar14->id;
            pmVar15 = std::
                      map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                    *)&local_d0,&local_1e0);
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            pcVar8 = (pmVar15->first)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,pcVar8,pcVar8 + (pmVar15->first)._M_string_length);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                      ::at(&local_190->name2VarArray,&local_80);
            peVar9 = (pmVar16->
                     super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_194 = pvVar14->id;
            pmVar15 = std::
                      map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                    *)&local_d0,&local_194);
            uVar29 = (ulong)(pmVar15->second >> 2);
            piVar10 = (peVar9->initValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)((long)(peVar9->initValues).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar10 >> 2) <=
                uVar29) {
              uVar23 = std::__throw_out_of_range_fmt
                                 (
                                 "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_60);
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
              ::~_Rb_tree(&local_d0);
              _Unwind_Resume(uVar23);
            }
            iVar12 = piVar10[uVar29];
            (local_160->super_Inst).dest.super_Displayable._vptr_Displayable =
                 (_func_int **)&PTR_display_001ee058;
            (local_160->super_Inst).dest.id = uVar3;
            (local_160->super_Inst).super_Displayable._vptr_Displayable = local_168;
            (local_160->src).field_0x18 = 0;
            *(int *)&(local_160->src).field_0x8 = iVar12;
            (local_160->src).super_Displayable._vptr_Displayable = local_170;
            (local_160->src).shift = Lsl;
            (local_160->src).shift_amount = '\0';
            local_1d8 = local_160;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::AssignInst*>
                      (&_Stack_1d0,local_160);
            insts = local_178;
            local_1c8._0_8_ = local_1d8;
            local_1c8._8_8_ = _Stack_1d0._M_pi;
            local_1d8 = (AssignInst *)0x0;
            _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b8[0] = 0;
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::_M_insert_rval(local_178,__position,(value_type *)&local_1c8._M_first);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
              ::_S_vtable._M_arr[local_1b8[0]]._M_data)
                      (&local_1d9,
                       (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                        *)&local_1c8._M_first);
            local_1b8[0] = 0xff;
            if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d0._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::_M_erase(insts,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                              *)((long)__position._M_current +
                                (long)(insts->
                                      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                                (0x18 - (long)pvVar7)));
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      __position._M_current = __position._M_current + 1;
    } while (__position._M_current !=
             (insts->
             super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~_Rb_tree(&local_d0);
  return;
}

Assistant:

void optimize_functiom(
      std::string funcName, mir::inst::MirPackage& package,
      bmir_variable_table::BmirVariableTable& bmirVariableTable,
      std::vector<irGenerator::Instruction>& insts) {
    std::map<uint32_t, std::pair<std::string, uint32_t>> tmpVarId2Offset;
    std::map<uint32_t, std::string> tmpVarId2VarSingleName;
    for (auto instructionIter = insts.begin(); instructionIter != insts.end();
         instructionIter++) {
      if (instructionIter->index() == 0) {
        std::shared_ptr<mir::inst::Inst> mirInst =
            std::get<std::shared_ptr<mir::inst::Inst>>(*instructionIter);
        switch (mirInst->inst_kind()) {
          case mir::inst::InstKind::Ref: {
            mir::inst::RefInst* refInst = (mir::inst::RefInst*)mirInst.get();
            if (std::holds_alternative<std::string>(refInst->val)) {
              std::string& varName = std::get<std::string>(refInst->val);
              if (bmirVariableTable.hasNameKey(varName) &&
                  !bmirVariableTable.getVarArray(varName)->changed) {
                tmpVarId2Offset[refInst->dest] = {varName, 0};
              } else if (bmirVariableTable.hasVarSingle(varName) &&
                         !bmirVariableTable.getVarSingle(varName)->changed) {
                tmpVarId2VarSingleName[refInst->dest] = varName;
              }
            }
            break;
          }
          case mir::inst::InstKind::Load: {
            mir::inst::LoadInst* loadInst = (mir::inst::LoadInst*)mirInst.get();
            mir::inst::VarId& src = std::get<mir::inst::VarId>(loadInst->src);
            if (tmpVarId2Offset.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarArray(tmpVarId2Offset[src].first)
                                  ->initValues.at(tmpVarId2Offset[src].second /
                                                  mir::types::INT_SIZE)))));
              insts.erase(insts.begin() + index + 1);
            } else if (tmpVarId2VarSingleName.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarSingle(tmpVarId2VarSingleName[src])
                                  ->initValue))));
              insts.erase(insts.begin() + index + 1);
            }
            break;
          }
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opInst = (mir::inst::OpInst*)mirInst.get();
            if (tmpVarId2Offset.count(opInst->dest) > 0) {
              if (std::holds_alternative<int32_t>(opInst->rhs)) {
                tmpVarId2Offset[opInst->dest].second +=
                    std::get<int32_t>(opInst->rhs);
              } else {
                tmpVarId2Offset.erase(opInst->dest);
              }
            }
            break;
          }
          default:
            break;
        }
      } else if (instructionIter->index() == 2) {
        tmpVarId2Offset.clear();
      }
    }
  }